

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool array_container_is_subset(array_container_t *container1,array_container_t *container2)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  _Bool _Var5;
  
  iVar1 = container1->cardinality;
  _Var5 = false;
  iVar2 = 0;
  if (iVar1 <= container2->cardinality) {
    if (0 < iVar1) {
      iVar2 = 0;
      uVar3 = 1;
      do {
        if (container1->array[iVar2] == container2->array[uVar3 - 1]) {
          iVar2 = iVar2 + 1;
        }
        else if (container1->array[iVar2] <= container2->array[uVar3 - 1]) {
          return false;
        }
      } while ((iVar2 < iVar1) &&
              (bVar4 = uVar3 < (uint)container2->cardinality, uVar3 = uVar3 + 1, bVar4));
    }
    _Var5 = iVar2 == iVar1;
  }
  return _Var5;
}

Assistant:

bool array_container_is_subset(const array_container_t *container1,
                               const array_container_t *container2) {
    if (container1->cardinality > container2->cardinality) {
        return false;
    }
    int i1 = 0, i2 = 0;
    while (i1 < container1->cardinality && i2 < container2->cardinality) {
        if (container1->array[i1] == container2->array[i2]) {
            i1++;
            i2++;
        } else if (container1->array[i1] > container2->array[i2]) {
            i2++;
        } else {  // container1->array[i1] < container2->array[i2]
            return false;
        }
    }
    if (i1 == container1->cardinality) {
        return true;
    } else {
        return false;
    }
}